

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxwrapper_opengl.c
# Opt level: O0

void ksGpuWindow_Destroy(ksGpuWindow *window)

{
  ksGpuWindow *window_local;
  
  ksGpuContext_Destroy(&window->context);
  ksGpuDevice_Destroy(&window->device);
  if ((window->windowFullscreen & 1U) != 0) {
    ChangeVideoMode_XF86VidMode
              (window->xDisplay,window->xScreen,(int *)0x0,(int *)0x0,(float *)0x0,
               &window->desktopWidth,&window->desktopHeight,&window->desktopRefreshRate);
    XUngrabPointer(window->xDisplay,0);
    XUngrabKeyboard(window->xDisplay,0);
  }
  if (window->xWindow != 0) {
    XUnmapWindow(window->xDisplay,window->xWindow);
    XDestroyWindow(window->xDisplay,window->xWindow);
    window->xWindow = 0;
  }
  if (window->xColormap != 0) {
    XFreeColormap(window->xDisplay,window->xColormap);
    window->xColormap = 0;
  }
  if (window->xVisual != (XVisualInfo *)0x0) {
    XFree(window->xVisual);
    window->xVisual = (XVisualInfo *)0x0;
  }
  XFlush(window->xDisplay);
  XCloseDisplay(window->xDisplay);
  window->xDisplay = (Display *)0x0;
  return;
}

Assistant:

void ksGpuWindow_Destroy(ksGpuWindow *window) {
    ksGpuContext_Destroy(&window->context);
    ksGpuDevice_Destroy(&window->device);

    if (window->windowFullscreen) {
        ChangeVideoMode_XF86VidMode(window->xDisplay, window->xScreen, NULL, NULL, NULL, &window->desktopWidth,
                                    &window->desktopHeight, &window->desktopRefreshRate);

        XUngrabPointer(window->xDisplay, CurrentTime);
        XUngrabKeyboard(window->xDisplay, CurrentTime);
    }

    if (window->xWindow) {
        XUnmapWindow(window->xDisplay, window->xWindow);
        XDestroyWindow(window->xDisplay, window->xWindow);
        window->xWindow = 0;
    }

    if (window->xColormap) {
        XFreeColormap(window->xDisplay, window->xColormap);
        window->xColormap = 0;
    }

    if (window->xVisual) {
        XFree(window->xVisual);
        window->xVisual = NULL;
    }

    XFlush(window->xDisplay);
    XCloseDisplay(window->xDisplay);
    window->xDisplay = NULL;
}